

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingNegativeCase::SamplerBindingNegativeCase
          (SamplerBindingNegativeCase *this,Context *context,char *name,char *desc,
          ShaderType shaderType,TestType testType,ErrorType errorType,GLenum samplerType)

{
  allocator<char> local_51;
  string local_50;
  TestType local_30;
  ShaderType local_2c;
  TestType testType_local;
  ShaderType shaderType_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  SamplerBindingNegativeCase *this_local;
  
  local_30 = testType;
  local_2c = shaderType;
  _testType_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"u_sampler",&local_51);
  LayoutBindingNegativeCase::LayoutBindingNegativeCase
            (&this->super_LayoutBindingNegativeCase,context,name,desc,shaderType,testType,errorType,
             0x8b4d,0x8b4c,0x8e81,0x8e82,0x8872,0x8b4d,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_LayoutBindingNegativeCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__SamplerBindingNegativeCase_032c0f40;
  *(GLenum *)&(this->super_LayoutBindingNegativeCase).field_0x134 = samplerType;
  return;
}

Assistant:

SamplerBindingNegativeCase::SamplerBindingNegativeCase (Context&		context,
														const char*		name,
														const char*		desc,
														ShaderType		shaderType,
														TestType		testType,
														ErrorType		errorType,
														glw::GLenum		samplerType)
	: LayoutBindingNegativeCase		(context,
									 name,
									 desc,
									 shaderType,
									 testType,
									 errorType,
									 GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,
									 GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,
									 GL_MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS,
									 GL_MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS,
									 GL_MAX_TEXTURE_IMAGE_UNITS,
									 GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,
									 "u_sampler")
	, m_samplerType					(samplerType)
{
}